

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  char cVar1;
  char *pcVar2;
  cmOutputConverter *this_00;
  string cmd;
  string line;
  string color_name;
  string local_50;
  
  color_name._M_dataplus._M_p = (pointer)&color_name.field_2;
  color_name._M_string_length = 0;
  color_name.field_2._M_local_buf[0] = '\0';
  if (((((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
        ToolSupportsColor == true) && (this->ColorMakefile == true)) && (color - EchoDepend < 5)) {
    std::__cxx11::string::assign((char *)&color_name);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&line);
  pcVar2 = (text->_M_dataplus)._M_p;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    cVar1 = *pcVar2;
    if (cVar1 != '\r') {
      if (cVar1 == '\n') {
LAB_00440555:
        cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
        cmd._M_string_length = 0;
        cmd.field_2._M_local_buf[0] = '\0';
        if (color_name._M_string_length == 0 && progress == (EchoProgress *)0x0) {
          std::__cxx11::string::assign((char *)&cmd);
          cmOutputConverter::EscapeForShell(&local_50,this_00,&line,false,true,false);
          std::__cxx11::string::append((string *)&cmd);
        }
        else {
          std::__cxx11::string::assign((char *)&cmd);
          std::__cxx11::string::append((string *)&cmd);
          if (progress != (EchoProgress *)0x0) {
            std::__cxx11::string::append((char *)&cmd);
            cmOutputConverter::Convert(&local_50,this_00,&progress->Dir,FULL,SHELL);
            std::__cxx11::string::append((string *)&cmd);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::append((string *)&cmd);
            std::__cxx11::string::append((char *)&cmd);
          }
          cmOutputConverter::EscapeForShell(&local_50,this_00,&line,false,false,false);
          std::__cxx11::string::append((string *)&cmd);
        }
        std::__cxx11::string::~string((string *)&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(commands,&cmd);
        std::__cxx11::string::~string((string *)&cmd);
      }
      else {
        if (cVar1 != '\0') {
          std::__cxx11::string::push_back((char)&line);
          goto LAB_004406a2;
        }
        if (line._M_string_length != 0) goto LAB_00440555;
      }
      std::__cxx11::string::assign((char *)&line);
      if (*pcVar2 == '\0') {
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::string::~string((string *)&color_name);
        return;
      }
      progress = (EchoProgress *)0x0;
    }
LAB_004406a2:
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void
cmLocalUnixMakefileGenerator3::AppendEcho(std::vector<std::string>& commands,
                                          std::string const& text,
                                          EchoColor color,
                                          EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if(this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile)
    {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch(color)
      {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
      }
    }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for(const char* c = text.c_str();; ++c)
    {
    if(*c == '\n' || *c == '\0')
      {
      // Avoid writing a blank last line on end-of-string.
      if(*c != '\0' || !line.empty())
        {
        // Add a command to echo this line.
        std::string cmd;
        if(color_name.empty() && !progress)
          {
          // Use the native echo command.
          cmd = "@echo ";
          cmd += this->EscapeForShell(line, false, true);
          }
        else
          {
          // Use cmake to echo the text in color.
          cmd = "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ";
          cmd += color_name;
          if (progress)
            {
            cmd += "--progress-dir=";
            cmd += this->Convert(progress->Dir,
                                 cmLocalGenerator::FULL,
                                 cmLocalGenerator::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
            }
          cmd += this->EscapeForShell(line);
          }
        commands.push_back(cmd);
        }

      // Reset the line to emtpy.
      line = "";

      // Progress appears only on first line.
      progress = 0;

      // Terminate on end-of-string.
      if(*c == '\0')
        {
        return;
        }
      }
    else if(*c != '\r')
      {
      // Append this character to the current line.
      line += *c;
      }
    }
}